

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndexedTest.cpp
# Opt level: O3

int __thiscall vkt::Draw::DrawIndexedTests::init(DrawIndexedTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  int extraout_EAX;
  mapped_type *ppcVar2;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed> *pIVar3;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed> *pIVar4;
  TestSpec testSpec;
  string *local_188 [2];
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  undefined1 local_158 [24];
  _Rb_tree_node_base local_140;
  undefined8 local_120;
  VkPrimitiveTopology local_118;
  TestSpec local_110;
  TestSpec local_d8;
  TestSpec local_a0;
  TestSpec local_68;
  
  local_140._M_color = _S_red;
  local_140._M_parent = (_Base_ptr)0x0;
  local_120 = 0;
  local_188[0] = (string *)((ulong)local_188[0] & 0xffffffff00000000);
  local_140._M_left = &local_140;
  local_140._M_right = &local_140;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)(local_158 + 0x10),(key_type *)local_188);
  *ppcVar2 = "vulkan/draw/VertexFetch.vert";
  local_188[0] = (string *)CONCAT44(local_188[0]._4_4_,1);
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)(local_158 + 0x10),(key_type *)local_188);
  *ppcVar2 = "vulkan/draw/VertexFetch.frag";
  local_118 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  pIVar3 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed> *)operator_new(0xa8);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  local_188[0] = (string *)local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,"draw_indexed_triangle_list","");
  local_168._M_allocated_capacity = (size_type)(string *)local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_178 + 0x10),"Draws indexed triangle list","");
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)&local_68,
             (_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)(local_158 + 0x10));
  local_68.topology = local_118;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed>::InstanceFactory
            (pIVar3,pTVar1,local_188[0],(string *)local_168._M_allocated_capacity,&local_68);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar3);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_68);
  if ((string *)local_168._M_allocated_capacity != (string *)local_158) {
    operator_delete((void *)local_168._M_allocated_capacity,(ulong)(local_158._0_8_ + 1));
  }
  if (local_188[0] != (string *)local_178) {
    operator_delete(local_188[0],(ulong)(local_178._0_8_ + 1));
  }
  local_118 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  pIVar3 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed> *)operator_new(0xa8);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  local_188[0] = (string *)local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,"draw_indexed_triangle_strip","");
  local_168._M_allocated_capacity = (size_type)(string *)local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_178 + 0x10),"Draws indexed triangle strip","");
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)&local_a0,
             (_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)(local_158 + 0x10));
  local_a0.topology = local_118;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed>::InstanceFactory
            (pIVar3,pTVar1,local_188[0],(string *)local_168._M_allocated_capacity,&local_a0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar3);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_a0);
  if ((string *)local_168._M_allocated_capacity != (string *)local_158) {
    operator_delete((void *)local_168._M_allocated_capacity,(ulong)(local_158._0_8_ + 1));
  }
  if (local_188[0] != (string *)local_178) {
    operator_delete(local_188[0],(ulong)(local_178._0_8_ + 1));
  }
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)(local_158 + 0x10));
  local_140._M_color = _S_red;
  local_140._M_parent = (_Base_ptr)0x0;
  local_120 = 0;
  local_188[0] = (string *)((ulong)local_188[0] & 0xffffffff00000000);
  local_140._M_left = &local_140;
  local_140._M_right = &local_140;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)(local_158 + 0x10),(key_type *)local_188);
  *ppcVar2 = "vulkan/draw/VertexFetchInstancedFirstInstance.vert";
  local_188[0] = (string *)CONCAT44(local_188[0]._4_4_,1);
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)(local_158 + 0x10),(key_type *)local_188);
  *ppcVar2 = "vulkan/draw/VertexFetch.frag";
  local_118 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  pIVar4 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed> *)
           operator_new(0xa8);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  local_188[0] = (string *)local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,"draw_instanced_indexed_triangle_list","");
  local_168._M_allocated_capacity = (size_type)(string *)local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_178 + 0x10),"Draws indexed triangle list","");
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)&local_d8,
             (_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)(local_158 + 0x10));
  local_d8.topology = local_118;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed>::InstanceFactory
            (pIVar4,pTVar1,local_188[0],(string *)local_168._M_allocated_capacity,&local_d8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar4);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_d8);
  if ((string *)local_168._M_allocated_capacity != (string *)local_158) {
    operator_delete((void *)local_168._M_allocated_capacity,(ulong)(local_158._0_8_ + 1));
  }
  if (local_188[0] != (string *)local_178) {
    operator_delete(local_188[0],(ulong)(local_178._0_8_ + 1));
  }
  local_118 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  pIVar4 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed> *)
           operator_new(0xa8);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  local_188[0] = (string *)local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,"draw_instanced_indexed_triangle_strip","");
  local_168._M_allocated_capacity = (size_type)(string *)local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_178 + 0x10),"Draws indexed triangle strip","");
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)&local_110,
             (_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)(local_158 + 0x10));
  local_110.topology = local_118;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed>::InstanceFactory
            (pIVar4,pTVar1,local_188[0],(string *)local_168._M_allocated_capacity,&local_110);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar4);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_110);
  if ((string *)local_168._M_allocated_capacity != (string *)local_158) {
    operator_delete((void *)local_168._M_allocated_capacity,(ulong)(local_158._0_8_ + 1));
  }
  if (local_188[0] != (string *)local_178) {
    operator_delete(local_188[0],(ulong)(local_178._0_8_ + 1));
  }
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)(local_158 + 0x10));
  return extraout_EAX;
}

Assistant:

void DrawIndexedTests::init (void)
{
	{
		DrawIndexed::TestSpec testSpec;
		testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetch.vert";
		testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";

		testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
		addChild(new InstanceFactory<DrawIndexed>(m_testCtx, "draw_indexed_triangle_list", "Draws indexed triangle list", testSpec));
		testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
		addChild(new InstanceFactory<DrawIndexed>(m_testCtx, "draw_indexed_triangle_strip", "Draws indexed triangle strip", testSpec));
	}
	{
		DrawInstancedIndexed::TestSpec testSpec;
		testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetchInstancedFirstInstance.vert";
		testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";

		testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
		addChild(new InstanceFactory<DrawInstancedIndexed>(m_testCtx, "draw_instanced_indexed_triangle_list", "Draws indexed triangle list", testSpec));
		testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
		addChild(new InstanceFactory<DrawInstancedIndexed>(m_testCtx, "draw_instanced_indexed_triangle_strip", "Draws indexed triangle strip", testSpec));
	}
}